

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_add_passphrase.c
# Opt level: O3

void test_archive_read_add_passphrase_multiple_with_callback2(void)

{
  uint in_EAX;
  int iVar1;
  archive_read *a;
  char *pcVar2;
  uint uStack_38;
  int client_data;
  
  uStack_38 = in_EAX;
  a = (archive_read *)archive_read_new();
  _uStack_38 = (ulong)uStack_38;
  iVar1 = archive_read_add_passphrase((archive *)a,"pass1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
                      ,L'é',0,"ARCHIVE_OK",(long)iVar1,"archive_read_add_passphrase(a, \"pass1\")",
                      (void *)0x0);
  iVar1 = archive_read_add_passphrase((archive *)a,"pass2");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
                      ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_add_passphrase(a, \"pass2\")",
                      (void *)0x0);
  iVar1 = archive_read_set_passphrase_callback((archive *)a,&client_data,callback2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
                      ,L'ì',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_passphrase_callback(a, &client_data, callback2)",(void *)0x0
                     );
  __archive_read_reset_passphrase(a);
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ð',"pass1","\"pass1\"",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,
             L'\0');
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ò',"pass2","\"pass2\"",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,
             L'\0');
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ô',"passCallBack","\"passCallBack\"",pcVar2,"__archive_read_next_passphrase(ar)",
             (void *)0x0,L'\0');
  __archive_read_reset_passphrase(a);
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ø',"passCallBack","\"passCallBack\"",pcVar2,"__archive_read_next_passphrase(ar)",
             (void *)0x0,L'\0');
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ú',"pass1","\"pass1\"",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,
             L'\0');
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ü',"pass2","\"pass2\"",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,
             L'\0');
  pcVar2 = __archive_read_next_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'ÿ',(char *)0x0,"NULL",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,L'\0'
            );
  archive_read_free((archive *)a);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_add_passphrase_multiple_with_callback2)
{
	struct archive* a = archive_read_new();
	struct archive_read *ar = (struct archive_read *)a;
	int client_data = 0;

	assertEqualInt(ARCHIVE_OK, archive_read_add_passphrase(a, "pass1"));
	assertEqualInt(ARCHIVE_OK, archive_read_add_passphrase(a, "pass2"));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_passphrase_callback(a, &client_data, callback2));

	__archive_read_reset_passphrase(ar);
	/* Fist call, we should get "pass1" as a passphrase. */
	assertEqualString("pass1", __archive_read_next_passphrase(ar));
	/* Second call, we should get "pass2" as a passphrase. */
	assertEqualString("pass2", __archive_read_next_passphrase(ar));
	/* Third call, we should get "passCallBack" as a passphrase. */
	assertEqualString("passCallBack", __archive_read_next_passphrase(ar));

	__archive_read_reset_passphrase(ar);
	/* After reset passphrase, we should get "passCallBack" passphrase. */
	assertEqualString("passCallBack", __archive_read_next_passphrase(ar));
	/* Second call, we should get "pass1" as a passphrase. */
	assertEqualString("pass1", __archive_read_next_passphrase(ar));
	/* Third call, we should get "passCallBack" as a passphrase. */
	assertEqualString("pass2", __archive_read_next_passphrase(ar));
	/* Fourth call, we should get NULL which means all the passphrases
	 * are passed already. */
	assertEqualString(NULL, __archive_read_next_passphrase(ar));

	archive_read_free(a);
}